

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O0

void Ga2_ManCnfAddDynamic(Ga2_Man_t *p,int uTruth,int *Lits,int iLitOut,int ProofId)

{
  lit lVar1;
  long lVar2;
  lit local_5c;
  lit local_58 [2];
  int ClaLits [6];
  int local_38;
  int nClaLits;
  int Cube;
  int b;
  int k;
  int i;
  int ProofId_local;
  int iLitOut_local;
  int *Lits_local;
  int uTruth_local;
  Ga2_Man_t *p_local;
  
  b = 0;
  Lits_local._4_4_ = uTruth;
  do {
    if (1 < b) {
      return;
    }
    if (b != 0) {
      Lits_local._4_4_ = (Lits_local._4_4_ ^ 0xffffffff) & 0xffff;
    }
    for (Cube = 0; Cube < p->pSopSizes[(int)Lits_local._4_4_]; Cube = Cube + 1) {
      ClaLits[5] = 0;
      local_5c = iLitOut;
      if (b != 0) {
        local_5c = lit_neg(iLitOut);
      }
      lVar2 = (long)ClaLits[5];
      ClaLits[5] = ClaLits[5] + 1;
      ClaLits[lVar2 + -2] = local_5c;
      local_38 = (int)p->pSops[(int)Lits_local._4_4_][Cube];
      for (nClaLits = 3; -1 < nClaLits; nClaLits = nClaLits + -1) {
        if (local_38 % 3 == 0) {
          if (Lits[nClaLits] < 2) {
            __assert_fail("Lits[b] > 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGla.c"
                          ,0x29e,"void Ga2_ManCnfAddDynamic(Ga2_Man_t *, int, int *, int, int)");
          }
          lVar2 = (long)ClaLits[5];
          ClaLits[5] = ClaLits[5] + 1;
          ClaLits[lVar2 + -2] = Lits[nClaLits];
        }
        else if (local_38 % 3 == 1) {
          if (Lits[nClaLits] < 2) {
            __assert_fail("Lits[b] > 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGla.c"
                          ,0x2a3,"void Ga2_ManCnfAddDynamic(Ga2_Man_t *, int, int *, int, int)");
          }
          lVar1 = lit_neg(Lits[nClaLits]);
          lVar2 = (long)ClaLits[5];
          ClaLits[5] = ClaLits[5] + 1;
          ClaLits[lVar2 + -2] = lVar1;
        }
        local_38 = local_38 / 3;
      }
      sat_solver2_addclause(p->pSat,local_58,ClaLits + (long)ClaLits[5] + -2,ProofId);
    }
    b = b + 1;
  } while( true );
}

Assistant:

static inline void Ga2_ManCnfAddDynamic( Ga2_Man_t * p, int uTruth, int Lits[], int iLitOut, int ProofId )
{
    int i, k, b, Cube, nClaLits, ClaLits[6];
//    assert( uTruth > 0 && uTruth < 0xffff );
    for ( i = 0; i < 2; i++ )
    {
        if ( i )
            uTruth = 0xffff & ~uTruth;
//        Extra_PrintBinary( stdout, &uTruth, 16 ); printf( "\n" );
        for ( k = 0; k < p->pSopSizes[uTruth]; k++ )
        {
            nClaLits = 0;
            ClaLits[nClaLits++] = i ? lit_neg(iLitOut) : iLitOut;
            Cube = p->pSops[uTruth][k];
            for ( b = 3; b >= 0; b-- )
            {
                if ( Cube % 3 == 0 ) // value 0 --> add positive literal
                {
                    assert( Lits[b] > 1 );
                    ClaLits[nClaLits++] = Lits[b];
                }
                else if ( Cube % 3 == 1 ) // value 1 --> add negative literal
                {
                    assert( Lits[b] > 1 );
                    ClaLits[nClaLits++] = lit_neg(Lits[b]);
                }
                Cube = Cube / 3;
            }
            sat_solver2_addclause( p->pSat, ClaLits, ClaLits+nClaLits, ProofId );
        }
    }
}